

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

void layout_menu(gamewin *gw)

{
  int iVar1;
  gamewin *__s;
  _func_void_gamewin_ptr *p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  _func_void_gamewin_ptr *p_Var15;
  ulong uVar16;
  _func_void_gamewin_ptr *__s_00;
  wchar_t colwidth [16];
  int local_a0;
  int local_78 [18];
  
  iVar14 = *(int *)((long)&gw[4].resize + 4);
  uVar7 = 0;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  iVar11 = *(int *)&gw[4].win;
  if (*(int *)&gw[4].win < 1) {
    iVar11 = 0;
  }
  iVar8 = *(int *)((long)&gw[4].win + 4);
  iVar3 = _COLS;
  if (iVar8 < _COLS) {
    iVar3 = iVar8;
  }
  if (iVar8 < 1) {
    iVar3 = _COLS;
  }
  iVar8 = *(int *)&gw[4].next;
  iVar4 = _LINES;
  if (iVar8 < _LINES) {
    iVar4 = iVar8;
  }
  if (iVar8 < 1) {
    iVar4 = _LINES;
  }
  *(undefined4 *)&gw[2].resize = 2;
  __s = gw[1].next;
  iVar8 = 2;
  if ((__s != (gamewin *)0x0) && (*(char *)&__s->draw != '\0')) {
    *(undefined4 *)&gw[2].resize = 4;
    iVar8 = 4;
  }
  iVar1 = *(int *)&gw[1].prev;
  iVar9 = 0x34;
  if (iVar1 < 0x34) {
    iVar9 = iVar1;
  }
  iVar10 = iVar9 + iVar8;
  if (iVar4 - iVar11 <= iVar9 + iVar8) {
    iVar10 = iVar4 - iVar11;
  }
  *(int *)((long)&gw[2].draw + 4) = iVar10;
  *(int *)((long)&gw[2].resize + 4) = iVar10 - iVar8;
  *(undefined4 *)&gw[4].resize = 0;
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0;
  local_78[0xf] = 0;
  local_78[8] = 0;
  local_78[9] = 0;
  local_78[10] = 0;
  local_78[0xb] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_a0 = 0;
  if (0 < (long)iVar1) {
    p_Var2 = gw[1].resize;
    uVar7 = 0;
    lVar13 = 0;
    local_a0 = 0;
    do {
      __s_00 = p_Var2 + lVar13 * 0x10c + 8;
      pcVar5 = strchr((char *)__s_00,9);
      if (pcVar5 == (char *)0x0) {
        p_Var15 = p_Var2 + lVar13 * 0x10c;
        sVar6 = strlen((char *)__s_00);
        iVar8 = (int)sVar6;
        iVar11 = iVar8;
        if ((*(int *)(p_Var15 + 4) == 1) && (iVar11 = iVar8 + 4, *(int *)p_Var15 == 0)) {
          iVar11 = iVar8;
        }
        if (iVar11 < local_a0) {
          iVar11 = local_a0;
        }
      }
      else {
        uVar12 = 0;
        do {
          iVar11 = (int)((long)pcVar5 - (long)__s_00);
          if ((long)pcVar5 - (long)__s_00 < (long)local_78[uVar12]) {
            iVar11 = local_78[uVar12];
          }
          local_78[uVar12] = iVar11;
          __s_00 = (_func_void_gamewin_ptr *)(pcVar5 + 1);
          uVar16 = uVar12 + 1;
          pcVar5 = strchr((char *)__s_00,9);
        } while ((uVar12 < 0xf) && (uVar12 = uVar16, pcVar5 != (char *)0x0));
        iVar11 = local_78[uVar16];
        sVar6 = strlen((char *)__s_00);
        iVar8 = (int)sVar6;
        if (sVar6 < (ulong)(long)iVar11) {
          iVar8 = iVar11;
        }
        local_78[uVar16] = iVar8;
        uVar12 = uVar16 & 0xffffffff;
        if ((int)uVar16 < (int)uVar7) {
          uVar12 = uVar7;
        }
        *(int *)&gw[4].resize = (int)uVar12;
        uVar7 = uVar12;
        iVar11 = local_a0;
      }
      local_a0 = iVar11;
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar1);
  }
  if (*(int *)((long)&gw[1].prev + 4) != 0) {
    local_78[0] = local_78[0] + 4;
  }
  iVar11 = (int)uVar7;
  if (0 < iVar11) {
    iVar8 = *(int *)&gw[2].next;
    uVar12 = 0;
    do {
      iVar8 = iVar8 + local_78[uVar12] + 1;
      *(int *)((long)&gw[2].next + uVar12 * 4 + 4) = iVar8;
      uVar12 = uVar12 + 1;
    } while (uVar7 != uVar12);
    uVar7 = (ulong)*(uint *)&gw[4].resize;
  }
  iVar4 = (int)uVar7;
  iVar8 = iVar4;
  if (local_a0 < local_78[iVar11] + *(int *)((long)&gw[2].next + (long)iVar11 * 4)) {
    if (0 < iVar4) {
      iVar11 = *(int *)&gw[2].next;
      uVar12 = 0;
      do {
        iVar11 = iVar11 + local_78[uVar12] + 1;
        *(int *)((long)&gw[2].next + uVar12 * 4 + 4) = iVar11;
        uVar12 = uVar12 + 1;
      } while (uVar7 != uVar12);
      iVar8 = *(int *)&gw[4].resize;
    }
    local_a0 = local_78[iVar4] + *(int *)((long)&gw[2].next + (long)iVar4 * 4);
  }
  iVar14 = (iVar3 - iVar14) + -4;
  if (local_a0 < iVar14) {
    iVar14 = local_a0;
  }
  *(int *)((long)&gw[2].win + 4) = iVar14;
  *(int *)&gw[2].win = iVar14 + 4;
  *(int *)((long)&gw[2].next + (long)iVar8 * 4 + 4) = iVar14 + 1;
  if ((__s != (gamewin *)0x0) &&
     (iVar14 = *(int *)&gw[2].win, sVar6 = strlen((char *)__s), (ulong)(long)iVar14 < sVar6 + 4)) {
    *(int *)((long)&gw[2].win + 4) = (int)sVar6;
    *(int *)&gw[2].win = (int)sVar6 + 4;
  }
  return;
}

Assistant:

static void layout_menu(struct gamewin *gw)
{
    struct win_menu *mdat = (struct win_menu*)gw->extra;
    int i, col, w, x1, x2, y1, y2;
    int colwidth[MAXCOLS];
    int scrheight;
    int scrwidth;
    int singlewidth = 0;
    
    x1 = (mdat->x1 > 0) ? mdat->x1 : 0;
    y1 = (mdat->y1 > 0) ? mdat->y1 : 0;
    x2 = (mdat->x2 > 0 && mdat->x2 <= COLS) ? mdat->x2 : COLS;
    y2 = (mdat->y2 > 0 && mdat->y2 <= LINES) ? mdat->y2 : LINES;
    
    scrheight = y2 - y1;
    scrwidth = x2 - x1;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    mdat->maxcol = 0;
    for (i = 0; i < MAXCOLS; i++)
	colwidth[i] = 0;
    
    for (i = 0; i < mdat->icount; i++) {
	/* headings without tabs are not fitted into columns, but headers with
	 * tabs are presumably column titles */
	if (!strchr(mdat->items[i].caption, '\t')) {
	    w = strlen(mdat->items[i].caption);
	    if (mdat->items[i].role == MI_NORMAL && mdat->items[i].id)
		w += 4;
	    singlewidth = max(singlewidth, w);
	} else {
	    col = calc_colwidths(mdat->items[i].caption, colwidth);
	    mdat->maxcol = max(mdat->maxcol, col);
	}
    }
    if (mdat->how != PICK_NONE)
	colwidth[0] += 4; /* "a - " */
    
    mdat->innerwidth = max(calc_menuwidth(colwidth, mdat->colpos, mdat->maxcol),
			   singlewidth);
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    mdat->colpos[mdat->maxcol+1] = mdat->innerwidth+1;
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}